

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O0

shared_ptr<Liby::TcpClient> __thiscall
Liby::EventLoopGroup::creatTcpClient(EventLoopGroup *this,string *host,string *service)

{
  string *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<Liby::TcpClient> sVar2;
  anon_class_24_2_459b0261 local_78;
  ResolverHandler local_60;
  undefined1 local_40 [8];
  weak_ptr<Liby::TcpClient> weakTcpClient;
  string *service_local;
  string *host_local;
  EventLoopGroup *this_local;
  shared_ptr<Liby::TcpClient> *tcpClient;
  
  weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 0;
  std::make_shared<Liby::TcpClient>();
  std::weak_ptr<Liby::TcpClient>::weak_ptr<Liby::TcpClient,void>
            ((weak_ptr<Liby::TcpClient> *)local_40,(shared_ptr<Liby::TcpClient> *)this);
  local_78.this = (EventLoopGroup *)host;
  std::weak_ptr<Liby::TcpClient>::weak_ptr
            (&local_78.weakTcpClient,(weak_ptr<Liby::TcpClient> *)local_40);
  std::function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)>::
  function<Liby::EventLoopGroup::creatTcpClient(std::__cxx11::string_const&,std::__cxx11::string_const&)::__0,void>
            ((function<void(std::__cxx11::list<Liby::Endpoint,std::allocator<Liby::Endpoint>>)> *)
             &local_60,&local_78);
  Resolver::async_resolve(service,in_RCX,&local_60);
  std::function<void_(std::__cxx11::list<Liby::Endpoint,_std::allocator<Liby::Endpoint>_>)>::
  ~function(&local_60);
  creatTcpClient(std::__cxx11::string_const&,std::__cxx11::string_const&)::$_0::~__0
            ((__0 *)&local_78);
  weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _7_1_ = 1;
  std::weak_ptr<Liby::TcpClient>::~weak_ptr((weak_ptr<Liby::TcpClient> *)local_40);
  _Var1._M_pi = extraout_RDX;
  if ((weakTcpClient.super___weak_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._7_1_ & 1) == 0) {
    std::shared_ptr<Liby::TcpClient>::~shared_ptr((shared_ptr<Liby::TcpClient> *)this);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Liby::TcpClient>)
         sVar2.super___shared_ptr<Liby::TcpClient,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TcpClient>
EventLoopGroup::creatTcpClient(const std::string &host,
                               const std::string &service) {
    std::shared_ptr<TcpClient> tcpClient = std::make_shared<TcpClient>();
    std::weak_ptr<TcpClient> weakTcpClient = tcpClient;

    Resolver::async_resolve(
        host, service, [this, weakTcpClient](std::list<Endpoint> eps) {
            if (weakTcpClient.expired() || eps.empty())
                return;

            auto tcpClient = weakTcpClient.lock();
            SockPtr sockPtr = std::make_shared<Socket>(eps.front());
            sockPtr->connect();

            EventLoop *loop = robinLoop1(sockPtr->fd());

            tcpClient->setEventLoop(loop);
            tcpClient->setSocket(sockPtr);

            // BUG tcpClient与当前线程不在一个线程上时,可能会引起内存错误
            //            tcpClient->start();
            // FIX
            if (loop == EventLoop::curr_thread_loop()) {
                tcpClient->start();
            } else {
                loop->runEventHandler([tcpClient] { tcpClient->start(); });
            }
        });
    return tcpClient;
}